

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

bc_trie_t * blogc_source_parse_from_file(bc_trie_t *conf,char *f,bc_error_t **err)

{
  ulong uVar1;
  bc_trie_t *trie;
  char *data;
  char *filename;
  bc_trie_t *rv;
  char *endptr;
  char *maxdepth;
  char *pcStack_38;
  int toctree_maxdepth;
  char *s;
  size_t len;
  bc_error_t **err_local;
  char *f_local;
  bc_trie_t *conf_local;
  
  if ((err == (bc_error_t **)0x0) || (*err != (bc_error_t *)0x0)) {
    conf_local = (bc_trie_t *)0x0;
  }
  else {
    len = (size_t)err;
    err_local = (bc_error_t **)f;
    f_local = (char *)conf;
    pcStack_38 = bc_file_get_contents(f,true,(size_t *)&s,err);
    if (pcStack_38 == (char *)0x0) {
      conf_local = (bc_trie_t *)0x0;
    }
    else {
      maxdepth._4_4_ = -1;
      endptr = (char *)bc_trie_lookup((bc_trie_t *)f_local,"TOCTREE_MAXDEPTH");
      if (endptr != (char *)0x0) {
        uVar1 = strtol(endptr,(char **)&rv,10);
        maxdepth._4_4_ = (int)uVar1;
        if ((*endptr != '\0') && (*(char *)&rv->root != '\0')) {
          fprintf(_stderr,
                  "warning: invalid value for \'TOCTREE_MAXDEPTH\' variable: %s. using %d instead\n"
                  ,endptr,uVar1 & 0xffffffff);
        }
      }
      trie = blogc_source_parse(pcStack_38,(size_t)s,maxdepth._4_4_,(bc_error_t **)len);
      if ((trie != (bc_trie_t *)0x0) &&
         (data = blogc_get_filename((char *)err_local), data != (char *)0x0)) {
        bc_trie_insert(trie,"FILENAME",data);
      }
      free(pcStack_38);
      conf_local = trie;
    }
  }
  return conf_local;
}

Assistant:

bc_trie_t*
blogc_source_parse_from_file(bc_trie_t *conf, const char *f, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t len;
    char *s = bc_file_get_contents(f, true, &len, err);
    if (s == NULL)
        return NULL;

    int toctree_maxdepth = -1;
    const char *maxdepth = bc_trie_lookup(conf, "TOCTREE_MAXDEPTH");
    if (maxdepth != NULL) {
        char *endptr;
        toctree_maxdepth = strtol(maxdepth, &endptr, 10);
        if (*maxdepth != '\0' && *endptr != '\0') {
            fprintf(stderr, "warning: invalid value for 'TOCTREE_MAXDEPTH' "
                "variable: %s. using %d instead\n", maxdepth, toctree_maxdepth);
        }
    }

    bc_trie_t *rv = blogc_source_parse(s, len, toctree_maxdepth, err);

    // set FILENAME variable
    if (rv != NULL) {
        char *filename = blogc_get_filename(f);
        if (filename != NULL)
            bc_trie_insert(rv, "FILENAME", filename);
    }

    free(s);
    return rv;
}